

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::visit<Imath_2_5::Vec3<int>>
               (int *level,int n,int k,vector<int,_std::allocator<int>_> *value,
               vector<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_> *perms)

{
  reference pvVar1;
  vector<int,_std::allocator<int>_> *in_RCX;
  int in_EDX;
  int in_ESI;
  vector<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_> *in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  int i;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  value_type vVar2;
  int iVar3;
  
  *(int *)&(in_RDI->super__Vector_base<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_>
           )._M_impl.super__Vector_impl_data._M_start =
       *(int *)&(in_RDI->
                super__Vector_base<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_>).
                _M_impl.super__Vector_impl_data._M_start + 1;
  vVar2 = *(value_type *)
           &(in_RDI->
            super__Vector_base<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)in_EDX);
  *pvVar1 = vVar2;
  if (*(int *)&(in_RDI->
               super__Vector_base<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_>).
               _M_impl.super__Vector_impl_data._M_start == in_ESI) {
    addItem<Imath_2_5::Vec3<int>>(unaff_retaddr,in_RDI);
  }
  else {
    for (iVar3 = 0; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)iVar3);
      if (*pvVar1 == 0) {
        visit<Imath_2_5::Vec3<int>>
                  ((int *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),(int)in_RCX,in_R8,
                   (vector<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_> *)
                   CONCAT44(iVar3,vVar2));
      }
    }
  }
  *(int *)&(in_RDI->super__Vector_base<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_>
           )._M_impl.super__Vector_impl_data._M_start =
       *(int *)&(in_RDI->
                super__Vector_base<Imath_2_5::Vec3<int>,_std::allocator<Imath_2_5::Vec3<int>_>_>).
                _M_impl.super__Vector_impl_data._M_start + -1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)in_EDX);
  *pvVar1 = 0;
  return;
}

Assistant:

static void
visit(int &level, int n, int k, std::vector<int> &value, std::vector<T> &perms)
{
    level = level + 1;
    value[k] = level;

    if (level == n)
        addItem(value, perms);
    else
        for (int i = 0; i < n; i++)
            if (value[i] == 0)
                visit(level, n, i, value, perms);

    level = level - 1;
    value[k] = 0;
}